

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::JapaneseCalendar::getDefaultDayInMonth(JapaneseCalendar *this,int32_t eyear,int32_t month)

{
  UErrorCode local_38;
  int local_34;
  UErrorCode status;
  int32_t eraStart [3];
  int32_t day;
  int32_t era;
  int32_t month_local;
  int32_t eyear_local;
  JapaneseCalendar *this_local;
  
  eraStart[2] = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x32])
                          ();
  eraStart[1] = 1;
  memset(&local_34,0,0xc);
  local_38 = U_ZERO_ERROR;
  EraRules::getStartDate(gJapaneseEraRules,eraStart[2],(int32_t (*) [3])&local_34,&local_38);
  if ((eyear == local_34) && (month == status + ~U_ZERO_ERROR)) {
    this_local._4_4_ = eraStart[0];
  }
  else {
    this_local._4_4_ = eraStart[1];
  }
  return this_local._4_4_;
}

Assistant:

int32_t JapaneseCalendar::getDefaultDayInMonth(int32_t eyear, int32_t month) 
{
    int32_t era = internalGetEra();
    int32_t day = 1;

    int32_t eraStart[3] = { 0,0,0 };
    UErrorCode status = U_ZERO_ERROR;
    gJapaneseEraRules->getStartDate(era, eraStart, status);
    U_ASSERT(U_SUCCESS(status));
    if(eyear == eraStart[0]) {
        if(month == eraStart[1] - 1) {
            return eraStart[2];
        }
    }

    return day;
}